

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

int deqp::egl::SurfaceConfig::getYuvOrderRank(EGLenum order)

{
  int iVar1;
  TestError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  code *local_30;
  EGLenum local_28;
  
  switch(order) {
  case 0x3302:
    iVar1 = 1;
    break;
  case 0x3303:
    iVar1 = 2;
    break;
  case 0x3304:
    iVar1 = 3;
    break;
  case 0x3305:
    iVar1 = 5;
    break;
  case 0x3306:
    iVar1 = 4;
    break;
  case 0x3307:
    iVar1 = 6;
    break;
  case 0x3308:
    iVar1 = 7;
    break;
  default:
    iVar1 = 0;
    if (order != 0x3038) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Unknown YUV order: ","");
      local_30 = eglu::getYuvOrderName;
      local_28 = order;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_30);
      std::operator+(&local_50,&local_90,&local_70);
      tcu::TestError::TestError
                (this,local_50._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x81);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return iVar1;
}

Assistant:

static int getYuvOrderRank (EGLenum order)
	{
		switch (order)
		{
			case EGL_NONE:					return 0;
			case EGL_YUV_ORDER_YUV_EXT:		return 1;
			case EGL_YUV_ORDER_YVU_EXT:		return 2;
			case EGL_YUV_ORDER_YUYV_EXT:	return 3;
			case EGL_YUV_ORDER_YVYU_EXT:	return 4;
			case EGL_YUV_ORDER_UYVY_EXT:	return 5;
			case EGL_YUV_ORDER_VYUY_EXT:	return 6;
			case EGL_YUV_ORDER_AYUV_EXT:	return 7;
			default:
				TCU_THROW(TestError, (std::string("Unknown YUV order: ") + eglu::getYuvOrderStr(order).toString()).c_str());
		}
	}